

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool mips_cpu_tlb_fill_mips
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uint *puVar1;
  undefined4 uVar2;
  byte bVar3;
  _Bool _Var4;
  int tlb_error;
  ulong uVar5;
  sbyte sVar6;
  sbyte sVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  target_ulong_conflict real_address;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined7 in_register_00000089;
  uint uVar14;
  uint uVar15;
  target_ulong_conflict tmp_entryhi;
  CPUMIPSState *env;
  ulong uVar16;
  bool bVar17;
  int in_stack_ffffffffffffff18;
  uint64_t *puVar18;
  _Bool huge_page;
  _Bool hgpg_mdhit;
  _Bool hgpg_udhit;
  _Bool hgpg_gdhit;
  uint local_dc;
  CPUMIPSState *local_d8;
  int prot;
  ulong local_c8;
  uint64_t pw_entrylo1;
  uint64_t pw_entrylo0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  MMUAccessType local_9c;
  undefined8 local_98;
  ulong local_90;
  undefined8 local_88;
  TranslationBlock *pTStack_80;
  hwaddr physical;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  int local_5c;
  undefined4 local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  uint64_t paddr;
  uint local_34;
  
  local_58 = (undefined4)CONCAT71(in_register_00000089,probe);
  env = (CPUMIPSState *)(cs[1].tb_jmp_cache + 0x13f);
  real_address = (target_ulong_conflict)address;
  tlb_error = get_physical_address
                        (env,&physical,&prot,real_address,access_type,mmu_idx,
                         in_stack_ffffffffffffff18);
  if (tlb_error == -2) {
    tlb_error = -2;
    if ((uint)cs[1].tb_jmp_cache[0x6b8]->pc < 2) goto LAB_006c01f1;
    uVar9 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
    *(uint *)((long)cs[1].tb_jmp_cache + 0x358c) = uVar9 & 0xfffffffc;
    uVar12 = *(uint *)((long)cs[1].tb_jmp_cache + 0xec4);
    local_a0 = uVar12 >> 0xc & 0x3f;
    uVar11 = uVar12 & 0x3f;
    huge_page = false;
    hgpg_gdhit = false;
    hgpg_udhit = false;
    hgpg_mdhit = false;
    pw_entrylo0 = 0;
    pw_entrylo1 = 0;
    iVar13 = ((uVar12 >> 0x1e & 1) != 0) + 2;
    uVar14 = *(uint *)(cs[1].tb_jmp_cache + 0x1d8);
    local_48 = (ulong)uVar14;
    local_64 = uVar14 >> 0x18;
    local_a4 = local_64 & 0x3f;
    local_68 = uVar14 >> 0x12;
    iVar10 = -1;
    local_88 = (TranslationBlock *)(CONCAT44(local_88._4_4_,uVar12 >> 0x18) & 0xffffffff0000003f);
    local_a8 = local_68 & 0x3f;
    sVar6 = (sbyte)local_a8;
    local_98 = CONCAT44(local_98._4_4_,uVar12 >> 0x12) & 0xffffffff0000003f;
    local_6c = uVar14 >> 0xc;
    local_ac = local_6c & 0x3f;
    sVar7 = (sbyte)local_ac;
    bVar8 = (byte)local_a0;
    local_60 = uVar14 >> 6 & 0x3f;
    if (uVar11 < 2) {
      iVar10 = (uint)(uVar11 == 1 & *(byte *)((long)cs[1].tb_jmp_cache + 0xecc) >> 6) + iVar13;
    }
    local_dc = uVar9 & 3;
    bVar3 = (byte)iVar10;
    uVar5 = 0xff;
    if (uVar11 < 2) {
      uVar5 = (ulong)(iVar13 + (uint)(uVar11 == 1));
    }
    uVar15 = (((uint)(address >> (sbyte)local_60) & ~(-1 << ((byte)(uVar12 >> 6) & 0x1f))) >> 1) <<
             ((char)uVar5 + 1U & 0x1f);
    uVar14 = local_dc;
    local_d8 = env;
    local_9c = access_type;
    local_5c = mmu_idx;
    if (((*(byte *)((long)cs[1].tb_jmp_cache + 0xf6b) & 1) != 0) &&
       (*(int *)((long)cs[1].tb_jmp_cache + 0xecc) < 0)) {
      if ((((uint)local_88 != 0 || (int)local_98 != 0) || local_a0 != 0) &&
         ((uVar11 < 2 && (iVar10 != -1)))) {
        uVar16 = (ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0xebc);
        bVar17 = (uint)local_88 == 0;
        local_88 = (TranslationBlock *)CONCAT44(local_88._4_4_,1 << ((char)uVar5 + 3U & 0x1f));
        local_50 = uVar5;
        if (bVar17) {
LAB_006c0298:
          if ((int)local_98 != 0) {
            local_c8 = uVar16 | (long)(int)(((uint)(address >> sVar6) &
                                            ~(-1 << ((byte)(uVar12 >> 0x12) & 0x1f))) <<
                                           (bVar3 & 0x1f));
            puVar18 = &pw_entrylo1;
            iVar10 = walk_directory(local_d8,&local_c8,local_a8,&huge_page,&hgpg_udhit,&pw_entrylo0,
                                    puVar18);
            in_stack_ffffffffffffff18 = (int)puVar18;
            uVar14 = local_dc;
            uVar9 = local_dc;
            if (iVar10 == 0) goto LAB_006c01e0;
            uVar16 = local_c8;
            if (iVar10 == 1) goto LAB_006c033b;
          }
          if (local_a0 != 0) {
            local_c8 = uVar16 | (long)(int)(((uint)(address >> sVar7) & ~(-1 << (bVar8 & 0x1f))) <<
                                           (bVar3 & 0x1f));
            puVar18 = &pw_entrylo1;
            iVar10 = walk_directory(local_d8,&local_c8,local_ac,&huge_page,&hgpg_mdhit,&pw_entrylo0,
                                    puVar18);
            in_stack_ffffffffffffff18 = (int)puVar18;
            uVar14 = local_dc;
            uVar9 = local_dc;
            if (iVar10 == 0) goto LAB_006c01e0;
            uVar16 = local_c8;
            if (iVar10 == 1) goto LAB_006c033b;
          }
          uVar16 = (long)(int)uVar15 | uVar16;
          uVar9 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
          uVar12 = uVar9 & 3;
          if ((uVar9 >> 0x1c & 1) != 0) {
            uVar12 = 3;
          }
          iVar10 = get_physical_address
                             (local_d8,&paddr,&local_54,(target_ulong_conflict)uVar16,0,uVar12,
                              in_stack_ffffffffffffff18);
          uVar14 = local_dc;
          uVar9 = local_dc;
          if (iVar10 == 0) {
            _Var4 = get_pte(local_d8,uVar16,(uint)local_88,&local_90);
            uVar14 = local_dc;
            uVar9 = local_dc;
            if (_Var4) {
              uVar12 = (uint)local_48 & 0x3f;
              uVar9 = uVar12 - 0x20;
              if (uVar12 <= (uint)local_88) {
                uVar9 = uVar12;
              }
              local_98 = (ulong)(uVar9 - 2);
              local_90 = local_90 >> ((byte)(uVar9 - 2) & 0x3f);
              pw_entrylo0 = (ulong)(uint)((int)local_90 << 0x1e) | local_90 >> 2;
              uVar16 = uVar16 | (long)(int)(uVar15 | 1 << ((uint)local_50 & 0x1f));
              uVar9 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
              uVar12 = 3;
              if ((uVar9 >> 0x1c & 1) == 0) {
                uVar12 = uVar9 & 3;
              }
              local_90 = pw_entrylo0;
              iVar10 = get_physical_address
                                 (local_d8,&paddr,&local_54,(target_ulong_conflict)uVar16,0,uVar12,
                                  in_stack_ffffffffffffff18);
              uVar14 = local_dc;
              uVar9 = local_dc;
              if ((iVar10 == 0) &&
                 (_Var4 = get_pte(local_d8,uVar16,(uint)local_88,&local_90), uVar14 = local_dc,
                 uVar9 = local_dc, _Var4)) {
                uVar5 = local_90 >> ((byte)local_98 & 0x3f);
                pw_entrylo1 = (ulong)(uint)((int)uVar5 << 0x1e) | uVar5 >> 2;
                goto LAB_006c033b;
              }
            }
          }
        }
        else {
          local_c8 = uVar16 | (long)(int)(((uint)(address >> (sbyte)local_a4) &
                                          ~(-1 << ((byte)(uVar12 >> 0x18) & 0x1f))) <<
                                         (bVar3 & 0x1f));
          puVar18 = &pw_entrylo1;
          iVar10 = walk_directory(env,&local_c8,local_a4,&huge_page,&hgpg_gdhit,&pw_entrylo0,puVar18
                                 );
          in_stack_ffffffffffffff18 = (int)puVar18;
          uVar14 = local_dc;
          uVar9 = local_dc;
          if (iVar10 != 0) {
            uVar16 = local_c8;
            if (iVar10 != 1) goto LAB_006c0298;
LAB_006c033b:
            env = local_d8;
            local_34 = ~(-1 << ((byte)local_60 & 0x1f));
            if (huge_page == true) {
              uVar9 = (uint)hgpg_mdhit | (uint)hgpg_gdhit * 4 + (uint)hgpg_udhit * 2;
              if (uVar9 == 1) {
                local_34 = ~(-1 << ((byte)local_ac & 0x1f));
                bVar8 = (byte)local_6c;
              }
              else if (uVar9 == 2) {
                local_34 = ~(-1 << ((byte)local_a8 & 0x1f));
                bVar8 = (byte)local_68;
              }
              else {
                if (uVar9 != 4) goto LAB_006c050e;
                local_34 = ~(-1 << ((byte)local_a4 & 0x1f));
                bVar8 = (byte)local_64;
              }
              local_34 = local_34 >> (bVar8 & 1);
            }
LAB_006c050e:
            local_34 = local_34 >> 0xc;
            update_pagemask_mips(local_d8,local_34 << 0xd,(int32_t *)&local_34);
            uVar9 = *(uint *)(cs[1].tb_jmp_cache + 0x1e5);
            uVar2 = *(undefined4 *)((long)cs[1].tb_jmp_cache + 0xea4);
            *(target_ulong_conflict *)(cs[1].tb_jmp_cache + 0x1e5) =
                 real_address & 0xffffe000 | uVar9 & 0xff;
            *(uint *)((long)cs[1].tb_jmp_cache + 0xea4) = local_34;
            local_88 = cs[1].tb_jmp_cache[0x1d1];
            pTStack_80 = cs[1].tb_jmp_cache[0x1d2];
            cs[1].tb_jmp_cache[0x1d1] = (TranslationBlock *)pw_entrylo0;
            cs[1].tb_jmp_cache[0x1d2] = (TranslationBlock *)pw_entrylo1;
            r4k_helper_tlbwr_mips(env);
            mmu_idx = local_5c;
            access_type = local_9c;
            *(uint *)(cs[1].tb_jmp_cache + 0x1e5) = uVar9;
            *(undefined4 *)((long)cs[1].tb_jmp_cache + 0xea4) = uVar2;
            cs[1].tb_jmp_cache[0x1d1] = local_88;
            cs[1].tb_jmp_cache[0x1d2] = pTStack_80;
            puVar1 = (uint *)((long)cs[1].tb_jmp_cache + 0x358c);
            *puVar1 = *puVar1 | local_dc;
            tlb_error = get_physical_address
                                  (env,&physical,&prot,real_address,local_9c,local_5c,
                                   in_stack_ffffffffffffff18);
            goto joined_r0x006c05d6;
          }
        }
      }
    }
LAB_006c01e0:
    local_dc = uVar9;
    puVar1 = (uint *)((long)cs[1].tb_jmp_cache + 0x358c);
    *puVar1 = *puVar1 | uVar14;
    env = local_d8;
    access_type = local_9c;
  }
  else {
joined_r0x006c05d6:
    if (tlb_error == 0) {
      tlb_set_page_mips(cs,real_address & 0xfffff000,(ulong)((uint)physical & 0xfffff000),prot,
                        mmu_idx,0x1000);
      return true;
    }
  }
LAB_006c01f1:
  if ((char)local_58 != '\0') {
    return false;
  }
  raise_mmu_exception(env,real_address,access_type,tlb_error);
  do_raise_exception_err_mips(env,cs->exception_index,*(int *)(cs[1].tb_jmp_cache + 0x6b1),retaddr);
}

Assistant:

bool mips_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr physical;
    int prot;
    int mips_access_type;
    int ret = TLBRET_BADADDR;

    /* data access */
    /* XXX: put correct access by using cpu_restore_state() correctly */
    mips_access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address,
                               access_type, mips_access_type, mmu_idx);
    switch (ret) {
    case TLBRET_MATCH:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " physical " TARGET_FMT_plx
                      " prot %d\n", __func__, address, physical, prot);
        break;
    default:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " ret %d\n", __func__, address,
                      ret);
        break;
    }
    if (ret == TLBRET_MATCH) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     physical & TARGET_PAGE_MASK, prot,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }
#if !defined(TARGET_MIPS64)
    if ((ret == TLBRET_NOMATCH) && (env->tlb->nb_tlb > 1)) {
        /*
         * Memory reads during hardware page table walking are performed
         * as if they were kernel-mode load instructions.
         */
        int mode = (env->hflags & MIPS_HFLAG_KSU);
        bool ret_walker;
        env->hflags &= ~MIPS_HFLAG_KSU;
        ret_walker = page_table_walk_refill(env, address, access_type, mmu_idx);
        env->hflags |= mode;
        if (ret_walker) {
            ret = get_physical_address(env, &physical, &prot, address,
                                       access_type, mips_access_type, mmu_idx);
            if (ret == TLBRET_MATCH) {
                tlb_set_page(cs, address & TARGET_PAGE_MASK,
                             physical & TARGET_PAGE_MASK, prot,
                             mmu_idx, TARGET_PAGE_SIZE);
                return true;
            }
        }
    }
#endif
    if (probe) {
        return false;
    }

    raise_mmu_exception(env, address, access_type, ret);
    do_raise_exception_err(env, cs->exception_index, env->error_code, retaddr);
}